

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

ECDSA_SIG * ECDSA_SIG_new(void)

{
  BIGNUM *pBVar1;
  ECDSA_SIG *sig;
  
  sig = (ECDSA_SIG *)OPENSSL_malloc(0x10);
  if ((ECDSA_SIG *)sig == (ECDSA_SIG *)0x0) {
    sig = (ECDSA_SIG *)0x0;
  }
  else {
    pBVar1 = BN_new();
    ((ECDSA_SIG *)sig)->r = pBVar1;
    pBVar1 = BN_new();
    ((ECDSA_SIG *)sig)->s = pBVar1;
    if ((((ECDSA_SIG *)sig)->r == (BIGNUM *)0x0) || (((ECDSA_SIG *)sig)->s == (BIGNUM *)0x0)) {
      ECDSA_SIG_free((ECDSA_SIG *)sig);
      sig = (ECDSA_SIG *)0x0;
    }
  }
  return (ECDSA_SIG *)sig;
}

Assistant:

ECDSA_SIG *ECDSA_SIG_new(void) {
  ECDSA_SIG *sig =
      reinterpret_cast<ECDSA_SIG *>(OPENSSL_malloc(sizeof(ECDSA_SIG)));
  if (sig == NULL) {
    return NULL;
  }
  sig->r = BN_new();
  sig->s = BN_new();
  if (sig->r == NULL || sig->s == NULL) {
    ECDSA_SIG_free(sig);
    return NULL;
  }
  return sig;
}